

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QMimeMagicRule>::growAppend
          (QCommonArrayOps<QMimeMagicRule> *this,QMimeMagicRule *b,QMimeMagicRule *e)

{
  QMimeMagicRule *pQVar1;
  long n;
  long in_FS_OFFSET;
  QArrayDataPointer<QMimeMagicRule> local_38;
  QMimeMagicRule *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    n = ((long)e - (long)b >> 3) * -0xf0f0f0f0f0f0f0f;
    local_38.d = (Data *)0x0;
    local_38.ptr = (QMimeMagicRule *)0x0;
    local_38.size = 0;
    pQVar1 = (this->super_Type).super_QGenericArrayOps<QMimeMagicRule>.
             super_QArrayDataPointer<QMimeMagicRule>.ptr;
    if ((b < pQVar1) ||
       (pQVar1 + (this->super_Type).super_QGenericArrayOps<QMimeMagicRule>.
                 super_QArrayDataPointer<QMimeMagicRule>.size <= b)) {
      QArrayDataPointer<QMimeMagicRule>::detachAndGrow
                ((QArrayDataPointer<QMimeMagicRule> *)this,GrowsAtEnd,n,(QMimeMagicRule **)0x0,
                 (QArrayDataPointer<QMimeMagicRule> *)0x0);
    }
    else {
      QArrayDataPointer<QMimeMagicRule>::detachAndGrow
                ((QArrayDataPointer<QMimeMagicRule> *)this,GrowsAtEnd,n,&local_20,&local_38);
    }
    QGenericArrayOps<QMimeMagicRule>::copyAppend
              ((QGenericArrayOps<QMimeMagicRule> *)this,local_20,
               (QMimeMagicRule *)(((long)e - (long)b) + (long)local_20));
    QArrayDataPointer<QMimeMagicRule>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }